

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourcesGL::LoadUniforms(ShaderResourcesGL *this,LoadUniformsAttribs *Attribs)

{
  pointer *ppTVar1;
  __node_base_ptr *this_00;
  GLContextState *this_01;
  undefined *puVar2;
  PFNGLGETACTIVEUNIFORMPROC p_Var3;
  PFNGLGETPROGRAMRESOURCEINDEXPROC p_Var4;
  PFNGLGETPROGRAMRESOURCENAMEPROC p_Var5;
  PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC p_Var6;
  PFNGLGETUNIFORMBLOCKINDEXPROC p_Var7;
  GLenum GVar8;
  GLint GVar9;
  GLenum GVar10;
  GLenum GVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  Char *pCVar15;
  undefined8 uVar16;
  GLenum *pGVar17;
  long lVar18;
  char *pcVar19;
  size_t sVar20;
  size_t sVar21;
  char *pcVar22;
  Uint32 *pUVar23;
  reference pvVar24;
  char *pcVar25;
  reference pvVar26;
  reference pUVar27;
  size_type sVar28;
  reference Vars_00;
  const_iterator RangeStart;
  const_iterator RangeEnd;
  IMemoryAllocator *RawAllocator;
  pointer *Images_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar29;
  bool local_752;
  PIPELINE_RESOURCE_FLAGS local_748;
  SHADER_RESOURCE_TYPE local_746;
  bool local_745;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  string msg_22;
  undefined1 local_658 [8];
  string msg_21;
  GLenum err_10;
  GLint BufferSize;
  value_type *Vars;
  UniformBufferInfo *UB;
  iterator __end2;
  iterator __begin2;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  *__range2;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  UBReflections;
  string msg_20;
  Uint32 local_5c0;
  SHADER_RESOURCE_TYPE local_5b9;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_5b8;
  undefined1 local_5b0;
  char *local_5a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_5a0;
  undefined1 local_598;
  char *local_590;
  undefined1 local_588 [8];
  string msg_19;
  StorageBlockInfo *sb;
  iterator __end5_1;
  iterator __begin5_1;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  *__range5_1;
  string msg_18;
  value_type *LastBlock_1;
  char *pcStack_510;
  int Ind_1;
  char *OpenBracketPtr_1;
  Int32 ArraySize_1;
  bool IsNewBlock_1;
  string msg_17;
  GLenum err_9;
  GLuint SBIndex;
  string msg_16;
  string msg_15;
  int local_490;
  GLenum err_8;
  GLsizei Length;
  int i_2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_480;
  char local_478;
  char *local_470;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_468;
  undefined1 local_460;
  char *local_458;
  undefined1 local_450 [8];
  string msg_14;
  UniformBufferInfo *ub;
  iterator __end5;
  iterator __begin5;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  *__range5;
  string msg_13;
  value_type *LastBlock;
  char *pcStack_3d8;
  int Ind;
  char *OpenBracketPtr;
  GLint ArraySize;
  bool IsNewBlock;
  string msg_12;
  GLenum err_7;
  GLuint UniformBlockIndex;
  string msg_11;
  string msg_10;
  GLsizei local_358;
  GLenum err_6;
  GLsizei NameLen_1;
  int i_1;
  ShaderCodeVariableDesc VarDesc;
  char *local_310;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_308;
  undefined1 local_300;
  char *local_2f8;
  PIPELINE_RESOURCE_FLAGS local_2ef;
  SHADER_RESOURCE_TYPE local_2ee;
  bool local_2ed;
  GLenum local_2ec;
  PIPELINE_RESOURCE_FLAGS ResourceFlags_1;
  SHADER_RESOURCE_TYPE ResourceType_1;
  bool IsBuffer_1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  _Stack_2e8;
  undefined1 local_2e0;
  char *local_2d8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2d0;
  undefined1 local_2c8;
  char *local_2c0;
  PIPELINE_RESOURCE_FLAGS local_2b5;
  SHADER_RESOURCE_TYPE local_2b4;
  bool local_2b3;
  bool local_2b2;
  RESOURCE_DIMENSION local_2b1;
  undefined1 local_2b0 [3];
  PIPELINE_RESOURCE_FLAGS ResourceFlags;
  SHADER_RESOURCE_TYPE ResourceType;
  bool IsBuffer;
  bool IsMS;
  RESOURCE_DIMENSION ResDim;
  string msg_9;
  string msg_8;
  string msg_7;
  GLenum err_5;
  GLint NameLen;
  GLint size;
  GLenum dataType;
  int i;
  vector<char,_std::allocator<char>_> Name;
  undefined1 local_218 [8];
  string msg_6;
  GLenum err_4;
  GLint MaxShaderStorageBlockNameLen;
  string msg_5;
  GLint local_1c8;
  GLenum err_3;
  GLint numActiveShaderStorageBlocks;
  int MaxNameLength;
  string _msg;
  undefined1 local_198 [4];
  GLint activeUniformBlockMaxLength;
  string msg_4;
  GLenum err_2;
  GLint numActiveUniformBlocks;
  string msg_3;
  GLenum err_1;
  GLint activeUniformMaxLength;
  string msg_2;
  GLint local_120;
  GLenum err;
  GLint numActiveUniforms;
  GLuint GLProgram;
  string msg_1;
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  UniformVars;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  NamesPool;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  StorageBlocks;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  Images;
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  Textures;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  UniformBlocks;
  undefined1 local_38 [8];
  string msg;
  LoadUniformsAttribs *Attribs_local;
  ShaderResourcesGL *this_local;
  
  msg.field_2._8_8_ = Attribs;
  if ((Attribs->SamplerResourceFlag != PIPELINE_RESOURCE_FLAG_NONE) &&
     (Attribs->SamplerResourceFlag != PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER)) {
    FormatString<char[100]>
              ((string *)local_38,
               (char (*) [100])
               "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags"
              );
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1c8);
    std::__cxx11::string::~string((string *)local_38);
  }
  std::
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ::vector((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
            *)&Textures.
               super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ::vector((vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
            *)&Images.
               super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ::vector((vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
            *)&StorageBlocks.
               super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ::vector((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
            *)&NamesPool._M_h._M_single_bucket);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&UniformVars.
                      super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ::vector((vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
            *)((long)&msg_1.field_2 + 8));
  bVar12 = GLObjectWrappers::GLObjWrapper::operator_cast_to_bool
                     (*(GLObjWrapper **)(msg.field_2._8_8_ + 8));
  if (!bVar12) {
    FormatString<char[16]>((string *)&numActiveUniforms,(char (*) [16])"Null GL program");
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1d6);
    std::__cxx11::string::~string((string *)&numActiveUniforms);
  }
  GLContextState::SetProgram
            (*(GLContextState **)(msg.field_2._8_8_ + 0x10),
             *(GLProgramObj **)(msg.field_2._8_8_ + 8));
  err = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                  (*(GLObjWrapper **)(msg.field_2._8_8_ + 8));
  this->m_ShaderStages = *(SHADER_TYPE *)msg.field_2._8_8_;
  local_120 = 0;
  (*__glewGetProgramiv)(err,0x8b86,&local_120);
  msg_2.field_2._12_4_ = glGetError();
  if (msg_2.field_2._12_4_ != 0) {
    LogError<false,char[45],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de,(char (*) [45])"Unable to get the number of active uniforms\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)&err_1,(char (*) [6])0x4585f6);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de);
    std::__cxx11::string::~string((string *)&err_1);
  }
  msg_3.field_2._12_4_ = 0;
  (*__glewGetProgramiv)(err,0x8b87,(GLint *)(msg_3.field_2._M_local_buf + 0xc));
  msg_3.field_2._8_4_ = glGetError();
  if (msg_3.field_2._8_4_ != 0) {
    LogError<false,char[47],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3,(char (*) [47])"Unable to get the maximum uniform name length\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)&err_2,(char (*) [6])0x4585f6);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3);
    std::__cxx11::string::~string((string *)&err_2);
  }
  msg_4.field_2._12_4_ = 0;
  (*__glewGetProgramiv)(err,0x8a36,(GLint *)(msg_4.field_2._M_local_buf + 0xc));
  msg_4.field_2._8_4_ = glGetError();
  if (msg_4.field_2._8_4_ != 0) {
    LogError<false,char[51],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7,(char (*) [51])"Unable to get the number of active uniform blocks\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_4.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_198,(char (*) [6])0x4585f6);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7);
    std::__cxx11::string::~string((string *)local_198);
  }
  _msg.field_2._12_4_ = 0;
  (*__glewGetProgramiv)(err,0x8a35,(GLint *)(_msg.field_2._M_local_buf + 0xc));
  iVar13 = glGetError();
  if (iVar13 != 0) {
    FormatString<char[53]>
              ((string *)&numActiveShaderStorageBlocks,
               (char (*) [53])"Unable to get the maximum uniform block name length.");
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar16 = std::__cxx11::string::c_str();
      (*(code *)puVar2)(1,uVar16,0);
    }
    std::__cxx11::string::~string((string *)&numActiveShaderStorageBlocks);
  }
  if ((int)_msg.field_2._12_4_ < 1) {
    _msg.field_2._12_4_ = 0x400;
  }
  pGVar17 = (GLenum *)
            std::max<int>((int *)(msg_3.field_2._M_local_buf + 0xc),
                          (int *)(_msg.field_2._M_local_buf + 0xc));
  err_3 = *pGVar17;
  local_1c8 = 0;
  if (__glewGetProgramInterfaceiv != (PFNGLGETPROGRAMINTERFACEIVPROC)0x0) {
    (*__glewGetProgramInterfaceiv)(err,0x92e6,0x92f5,&local_1c8);
    msg_5.field_2._12_4_ = glGetError();
    if (msg_5.field_2._12_4_ != 0) {
      LogError<false,char[51],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201,(char (*) [51])"Unable to get the number of shader storage blocks\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_5.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)&err_4,(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201);
      std::__cxx11::string::~string((string *)&err_4);
    }
    msg_6.field_2._12_4_ = 0;
    (*__glewGetProgramInterfaceiv)(err,0x92e6,0x92f6,(GLint *)(msg_6.field_2._M_local_buf + 0xc));
    msg_6.field_2._8_4_ = glGetError();
    if (msg_6.field_2._8_4_ != 0) {
      LogError<false,char[60],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206,(char (*) [60])
                        "Unable to get the maximum shader storage block name length\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_6.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_218,(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206);
      std::__cxx11::string::~string((string *)local_218);
    }
    pGVar17 = (GLenum *)std::max<int>((int *)&err_3,(int *)(msg_6.field_2._M_local_buf + 0xc));
    err_3 = *pGVar17;
  }
  Name.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0x200;
  pGVar17 = (GLenum *)
            std::max<int>((int *)&err_3,
                          (int *)&Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  field_0x14);
  err_3 = *pGVar17;
  lVar18 = (long)(int)err_3;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&i,lVar18 + 1,
             (allocator_type *)((long)&dataType + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&dataType + 3));
  for (size = 0; GVar10 = err, GVar8 = err_3, GVar9 = size, p_Var3 = __glewGetActiveUniform,
      size < local_120; size = size + 1) {
    NameLen = 0;
    err_5 = 0;
    msg_7.field_2._12_4_ = 0;
    pcVar19 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    (*p_Var3)(GVar10,GVar9,GVar8,(GLsizei *)(msg_7.field_2._M_local_buf + 0xc),(GLint *)&err_5,
              (GLenum *)&NameLen,pcVar19);
    msg_7.field_2._8_4_ = glGetError();
    if (msg_7.field_2._8_4_ != 0) {
      LogError<false,char[30],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x218,(char (*) [30])"Unable to get active uniform\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_7.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)((long)&msg_8.field_2 + 8),(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x218);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
    if ((int)msg_7.field_2._12_4_ < (int)err_3) {
      sVar20 = (size_t)(int)msg_7.field_2._12_4_;
      pcVar19 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)&i);
      sVar21 = strlen(pcVar19);
      if (sVar20 != sVar21) goto LAB_00237a3b;
    }
    else {
LAB_00237a3b:
      FormatString<char[23]>
                ((string *)((long)&msg_9.field_2 + 8),(char (*) [23])"Incorrect uniform name");
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x219);
      std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
    }
    if ((int)err_5 < 1) {
      FormatString<char[34]>((string *)local_2b0,(char (*) [34])"Size is expected to be at least 1")
      ;
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x21a);
      std::__cxx11::string::~string((string *)local_2b0);
    }
    GLTextureTypeToResourceDim(NameLen,&local_2b1,&local_2b2);
    if (((((NameLen - 0x8b5dU < 6) || (NameLen == 0x8d66)) || (NameLen - 0x8dc0U < 6)) ||
        ((NameLen - 0x8dc9U < 4 || (NameLen - 0x8dceU < 7)))) ||
       ((NameLen - 0x8dd6U < 3 || (NameLen - 0x900cU < 4)))) {
LAB_00237bf8:
      local_745 = true;
      if ((NameLen != 0x8dc2) && (local_745 = true, NameLen != 0x8dd0)) {
        local_745 = NameLen == 0x8dd8;
      }
      local_2b3 = local_745;
      local_746 = SHADER_RESOURCE_TYPE_BUFFER_SRV;
      if (local_745 == false) {
        local_746 = SHADER_RESOURCE_TYPE_TEXTURE_SRV;
      }
      local_2b4 = local_746;
      if (local_745 == false) {
        local_748 = *(PIPELINE_RESOURCE_FLAGS *)(msg.field_2._8_8_ + 4);
      }
      else {
        local_748 = PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;
      }
      local_2b5 = local_748;
      pcVar19 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)&i);
      RemoveArrayBrackets(pcVar19);
      local_2d8 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
      pVar29 = std::
               unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::emplace<char*>((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&UniformVars.
                                    super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8);
      _Stack_2e8._M_cur =
           (__node_type *)
           pVar29.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_2e0 = pVar29.second;
      local_2d0._M_cur = _Stack_2e8._M_cur;
      local_2c8 = local_2e0;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_2d0);
      local_2c0 = (char *)std::__cxx11::string::c_str();
      local_2ec = err_5;
      std::
      vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                ((vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
                  *)&Images.
                     super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c0,
                 (SHADER_TYPE *)msg.field_2._8_8_,&local_2b4,&local_2b5,&local_2ec,(uint *)&NameLen,
                 &local_2b1,&local_2b2);
    }
    else if (NameLen - 0x904cU < 0x21) {
      local_752 = true;
      if ((NameLen != 0x9051) && (local_752 = true, NameLen != 0x905c)) {
        local_752 = NameLen == 0x9067;
      }
      local_2ed = local_752;
      local_2ee = local_752 | SHADER_RESOURCE_TYPE_TEXTURE_UAV;
      local_2ef = local_752 << 2;
      pcVar19 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)&i);
      RemoveArrayBrackets(pcVar19);
      local_310 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
      pVar29 = std::
               unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::emplace<char*>((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&UniformVars.
                                    super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_310);
      local_308._M_cur =
           (__node_type *)
           pVar29.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_300 = pVar29.second;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_308);
      local_2f8 = (char *)std::__cxx11::string::c_str();
      VarDesc.pMembers._4_4_ = err_5;
      std::
      vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                ((vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
                  *)&StorageBlocks.
                     super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2f8,
                 (SHADER_TYPE *)msg.field_2._8_8_,&local_2ee,&local_2ef,
                 (uint *)((long)&VarDesc.pMembers + 4),(uint *)&NameLen,&local_2b1,&local_2b2);
    }
    else {
      if (NameLen - 0x9108U < 6) goto LAB_00237bf8;
      if (((*(byte *)(msg.field_2._8_8_ + 0x18) & 1) != 0) &&
         (GLDataTypeToShaderCodeVariableDesc((ShaderCodeVariableDesc *)&NameLen_1,NameLen),
         VarDesc.TypeName._1_1_ != '\0')) {
        _NameLen_1 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)&i);
        AddUniformBufferVariable
                  (err,size,(ShaderCodeVariableDesc *)&NameLen_1,
                   (vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                    *)((long)&msg_1.field_2 + 8),
                   *(SHADER_SOURCE_LANGUAGE *)(msg.field_2._8_8_ + 0x1c));
      }
    }
  }
  for (err_6 = 0; GVar11 = err, GVar10 = err_3, GVar8 = err_6,
      p_Var6 = __glewGetActiveUniformBlockName, (int)err_6 < (int)msg_4.field_2._12_4_;
      err_6 = err_6 + 1) {
    local_358 = 0;
    pcVar19 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    (*p_Var6)(GVar11,GVar8,GVar10,&local_358,pcVar19);
    msg_10.field_2._12_4_ = glGetError();
    if (msg_10.field_2._12_4_ != 0) {
      pcVar19 = "Unable to get active uniform block name\n";
      LogError<false,char[41],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2c8,(char (*) [41])"Unable to get active uniform block name\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_10.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)((long)&msg_11.field_2 + 8),(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2c8);
      std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
    }
    if (local_358 < (int)err_3) {
      sVar20 = (size_t)local_358;
      pcVar22 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)&i);
      sVar21 = strlen(pcVar22);
      if (sVar20 != sVar21) goto LAB_0023811d;
    }
    else {
LAB_0023811d:
      FormatString<char[29]>((string *)&err_7,(char (*) [29])"Incorrect uniform block name");
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2c9);
      std::__cxx11::string::~string((string *)&err_7);
    }
    GVar8 = err;
    p_Var7 = __glewGetUniformBlockIndex;
    pcVar22 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    msg_12.field_2._12_4_ = (*p_Var7)(GVar8,pcVar22);
    msg_12.field_2._8_4_ = glGetError();
    if (msg_12.field_2._8_4_ != 0) {
      pcVar19 = "Unable to get active uniform block index\n";
      LogError<false,char[42],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2d0,(char (*) [42])"Unable to get active uniform block index\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_12.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)&ArraySize,(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2d0);
      std::__cxx11::string::~string((string *)&ArraySize);
    }
    OpenBracketPtr._7_1_ = 1;
    OpenBracketPtr._0_4_ = 1;
    pcVar22 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    pcStack_3d8 = strchr(pcVar22,0x5b);
    if (pcStack_3d8 != (char *)0x0) {
      LastBlock._4_4_ = atoi(pcStack_3d8 + 1);
      LastBlock._0_4_ = LastBlock._4_4_ + 1;
      pUVar23 = (Uint32 *)std::max<int>((int *)&OpenBracketPtr,(int *)&LastBlock);
      OpenBracketPtr._0_4_ = *pUVar23;
      *pcStack_3d8 = '\0';
      bVar12 = std::
               vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
               ::empty((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                        *)&Textures.
                           super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar12) {
        pvVar24 = std::
                  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                  ::back((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          *)&Textures.
                             super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar22 = (pvVar24->super_GLResourceAttribs).Name;
        pcVar25 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
        iVar13 = strcmp(pcVar22,pcVar25);
        if (iVar13 == 0) {
          msg_13.field_2._12_4_ = (pvVar24->super_GLResourceAttribs).ArraySize;
          pUVar23 = (Uint32 *)
                    std::max<int>((int *)&OpenBracketPtr,(int *)(msg_13.field_2._M_local_buf + 0xc))
          ;
          OpenBracketPtr._0_4_ = *pUVar23;
          if (msg_12.field_2._12_4_ !=
              *(int *)&(pvVar24->super_GLResourceAttribs).field_0x14 + LastBlock._4_4_) {
            FormatString<char[52]>
                      ((string *)&__range5,
                       (char (*) [52])"Uniform block indices are expected to be continuous");
            pCVar15 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar15,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x2e5);
            std::__cxx11::string::~string((string *)&__range5);
          }
          (pvVar24->super_GLResourceAttribs).ArraySize = (Uint32)OpenBracketPtr;
          OpenBracketPtr._7_1_ = 0;
        }
        else {
          ppTVar1 = &Textures.
                     super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end5 = std::
                   vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                   ::begin((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                            *)ppTVar1);
          ub = (UniformBufferInfo *)
               std::
               vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
               ::end((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                      *)ppTVar1);
          while (bVar12 = __gnu_cxx::operator!=
                                    (&__end5,(__normal_iterator<Diligent::ShaderResourcesGL::UniformBufferInfo_*,_std::vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>_>
                                              *)&ub), bVar12) {
            msg_14.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<Diligent::ShaderResourcesGL::UniformBufferInfo_*,_std::vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>_>
                 ::operator*(&__end5);
            pcVar22 = (((reference)msg_14.field_2._8_8_)->super_GLResourceAttribs).Name;
            pcVar25 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)&i);
            iVar13 = strcmp(pcVar22,pcVar25);
            if (iVar13 == 0) {
              FormatString<char[30],char_const*,char[30]>
                        ((string *)local_450,(Diligent *)"Uniform block with the name \'",
                         (char (*) [30])msg_14.field_2._8_8_,
                         (char **)"\' has already been enumerated",(char (*) [30])pcVar19);
              pCVar15 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar15,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x2ed);
              std::__cxx11::string::~string((string *)local_450);
            }
            __gnu_cxx::
            __normal_iterator<Diligent::ShaderResourcesGL::UniformBufferInfo_*,_std::vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>_>
            ::operator++(&__end5);
          }
        }
      }
    }
    if ((OpenBracketPtr._7_1_ & 1) != 0) {
      local_470 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
      pVar29 = std::
               unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::emplace<char*>((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&UniformVars.
                                    super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_470);
      local_480._M_cur =
           (__node_type *)
           pVar29.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_478 = pVar29.second;
      local_468._M_cur = local_480._M_cur;
      local_460 = local_478;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_468);
      local_458 = (char *)std::__cxx11::string::c_str();
      i_2._3_1_ = 1;
      Length = (Uint32)OpenBracketPtr;
      std::
      vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                ((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
                  *)&Textures.
                     super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_458,
                 (SHADER_TYPE *)msg.field_2._8_8_,(SHADER_RESOURCE_TYPE *)((long)&i_2 + 3),
                 (uint *)&Length,(uint *)(msg_12.field_2._M_local_buf + 0xc));
    }
  }
  err_8 = 0;
  do {
    GVar11 = err;
    GVar10 = err_3;
    GVar8 = err_8;
    p_Var5 = __glewGetProgramResourceName;
    if (local_1c8 <= (int)err_8) {
      this_01 = *(GLContextState **)(msg.field_2._8_8_ + 0x10);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::Null();
      GLContextState::SetProgram(this_01,(GLProgramObj *)((long)&msg_20.field_2 + 0xc));
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::
      ~GLObjWrapper((GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper> *)
                    ((long)&msg_20.field_2 + 0xc));
      Images_00 = &StorageBlocks.
                   super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar19 = (char *)&NamesPool._M_h._M_single_bucket;
      AllocateResources(this,(vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                              *)&Textures.
                                 super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                         *)&Images.
                            super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                         *)Images_00,
                        (vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                         *)pcVar19);
      bVar12 = std::
               vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
               ::empty((vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                        *)((long)&msg_1.field_2 + 8));
      if (!bVar12) {
        if ((*(byte *)(msg.field_2._8_8_ + 0x18) & 1) == 0) {
          FormatString<char[26],char[36]>
                    ((string *)
                     &UBReflections.
                      super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Attribs.LoadUniformBufferReflection",(char (*) [36])Images_00);
          pCVar15 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar15,"LoadUniforms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x33a);
          std::__cxx11::string::~string
                    ((string *)
                     &UBReflections.
                      super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::
        vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
        vector((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                *)&__range2);
        ppTVar1 = &Textures.
                   super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end2 = std::
                 vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                 ::begin((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          *)ppTVar1);
        UB = (UniformBufferInfo *)
             std::
             vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
             ::end((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                    *)ppTVar1);
        while (bVar12 = __gnu_cxx::operator!=
                                  (&__end2,(__normal_iterator<Diligent::ShaderResourcesGL::UniformBufferInfo_*,_std::vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>_>
                                            *)&UB), bVar12) {
          pUVar27 = __gnu_cxx::
                    __normal_iterator<Diligent::ShaderResourcesGL::UniformBufferInfo_*,_std::vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>_>
                    ::operator*(&__end2);
          uVar14 = *(uint *)&(pUVar27->super_GLResourceAttribs).field_0x14;
          sVar28 = std::
                   vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                   ::size((vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                           *)((long)&msg_1.field_2 + 8));
          if (uVar14 < sVar28) {
            Vars_00 = std::
                      vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                      ::operator[]((vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                                    *)((long)&msg_1.field_2 + 8),
                                   (ulong)*(uint *)&(pUVar27->super_GLResourceAttribs).field_0x14);
            msg_21.field_2._12_4_ = 0;
            (*__glewGetActiveUniformBlockiv)
                      (err,*(GLuint *)&(pUVar27->super_GLResourceAttribs).field_0x14,0x8a40,
                       (GLint *)(msg_21.field_2._M_local_buf + 0xc));
            msg_21.field_2._8_4_ = glGetError();
            if (msg_21.field_2._8_4_ != 0) {
              pcVar19 = "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter";
              LogError<false,char[68],char[17],unsigned_int>
                        (false,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x345,(char (*) [68])
                                "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter"
                         ,(char (*) [17])"\nGL Error Code: ",
                         (uint *)(msg_21.field_2._M_local_buf + 8));
              FormatString<char[6]>((string *)local_658,(char (*) [6])0x4585f6);
              pCVar15 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar15,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x345);
              std::__cxx11::string::~string((string *)local_658);
            }
            uVar14 = StaticCast<unsigned_int,int>((int *)(msg_21.field_2._M_local_buf + 0xc));
            PrepareUBReflection((ShaderCodeBufferDescX *)((long)&msg_22.field_2 + 8),Vars_00,uVar14)
            ;
            std::
            vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
            ::emplace_back<Diligent::ShaderCodeBufferDescX>
                      ((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                        *)&__range2,(ShaderCodeBufferDescX *)((long)&msg_22.field_2 + 8));
            ShaderCodeBufferDescX::~ShaderCodeBufferDescX
                      ((ShaderCodeBufferDescX *)((long)&msg_22.field_2 + 8));
          }
          else {
            FormatString<char[15],unsigned_int,char[19]>
                      ((string *)local_6a0,(Diligent *)"Uniform block ",
                       (char (*) [15])&(pUVar27->super_GLResourceAttribs).field_0x14,
                       (uint *)" has no variables.",(char (*) [19])pcVar19);
            pCVar15 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar15,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x34b);
            std::__cxx11::string::~string((string *)local_6a0);
          }
          __gnu_cxx::
          __normal_iterator<Diligent::ShaderResourcesGL::UniformBufferInfo_*,_std::vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>_>
          ::operator++(&__end2);
        }
        RangeStart = std::
                     vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                     ::cbegin((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                               *)&__range2);
        RangeEnd = std::
                   vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                   ::cend((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                           *)&__range2);
        RawAllocator = GetRawAllocator();
        ShaderCodeBufferDescX::
        PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
                  ((ShaderCodeBufferDescX *)local_6b0,
                   (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                    )RangeStart._M_current,
                   (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                    )RangeEnd._M_current,RawAllocator);
        std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
                  (&this->m_UBReflectionBuffer,
                   (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                   local_6b0);
        std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
                  ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                   local_6b0);
        std::
        vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
        ~vector((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 *)&__range2);
      }
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i);
      std::
      vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
      ::~vector((vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                 *)((long)&msg_1.field_2 + 8));
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&UniformVars.
                           super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
      ::~vector((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                 *)&NamesPool._M_h._M_single_bucket);
      std::
      vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
      ::~vector((vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                 *)&StorageBlocks.
                    super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
      ::~vector((vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                 *)&Images.
                    super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
      ::~vector((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                 *)&Textures.
                    super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    local_490 = 0;
    pcVar22 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    pcVar19 = (char *)&local_490;
    (*p_Var5)(GVar11,0x92e6,GVar8,GVar10,(GLsizei *)pcVar19,pcVar22);
    msg_15.field_2._12_4_ = glGetError();
    if (msg_15.field_2._12_4_ != 0) {
      pcVar19 = "Unable to get shader storage block name\n";
      LogError<false,char[41],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x304,(char (*) [41])"Unable to get shader storage block name\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_15.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)((long)&msg_16.field_2 + 8),(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x304);
      std::__cxx11::string::~string((string *)(msg_16.field_2._M_local_buf + 8));
    }
    if (local_490 < (int)err_3) {
      sVar20 = (size_t)local_490;
      pcVar22 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)&i);
      sVar21 = strlen(pcVar22);
      if (sVar20 != sVar21) goto LAB_0023882e;
    }
    else {
LAB_0023882e:
      FormatString<char[36]>((string *)&err_9,(char (*) [36])"Incorrect shader storage block name");
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x305);
      std::__cxx11::string::~string((string *)&err_9);
    }
    GVar8 = err;
    p_Var4 = __glewGetProgramResourceIndex;
    pcVar22 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    msg_17.field_2._12_4_ = (*p_Var4)(GVar8,0x92e6,pcVar22);
    msg_17.field_2._8_4_ = glGetError();
    if (msg_17.field_2._8_4_ != 0) {
      pcVar19 = "Unable to get shader storage block index\n";
      LogError<false,char[42],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x308,(char (*) [42])"Unable to get shader storage block index\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_17.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)&ArraySize_1,(char (*) [6])0x4585f6);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x308);
      std::__cxx11::string::~string((string *)&ArraySize_1);
    }
    OpenBracketPtr_1._7_1_ = 1;
    OpenBracketPtr_1._0_4_ = 1;
    pcVar22 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)&i);
    pcStack_510 = strchr(pcVar22,0x5b);
    if (pcStack_510 != (char *)0x0) {
      LastBlock_1._4_4_ = atoi(pcStack_510 + 1);
      LastBlock_1._0_4_ = LastBlock_1._4_4_ + 1;
      pUVar23 = (Uint32 *)std::max<int>((int *)&OpenBracketPtr_1,(int *)&LastBlock_1);
      OpenBracketPtr_1._0_4_ = *pUVar23;
      *pcStack_510 = '\0';
      bVar12 = std::
               vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
               ::empty((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                        *)&NamesPool._M_h._M_single_bucket);
      if (!bVar12) {
        pvVar26 = std::
                  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                  ::back((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          *)&NamesPool._M_h._M_single_bucket);
        pcVar22 = (pvVar26->super_GLResourceAttribs).Name;
        pcVar25 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
        iVar13 = strcmp(pcVar22,pcVar25);
        if (iVar13 == 0) {
          msg_18.field_2._12_4_ = (pvVar26->super_GLResourceAttribs).ArraySize;
          pUVar23 = (Uint32 *)
                    std::max<int>((int *)&OpenBracketPtr_1,
                                  (int *)(msg_18.field_2._M_local_buf + 0xc));
          OpenBracketPtr_1._0_4_ = *pUVar23;
          if (msg_17.field_2._12_4_ !=
              *(int *)&(pvVar26->super_GLResourceAttribs).field_0x14 + LastBlock_1._4_4_) {
            FormatString<char[52]>
                      ((string *)&__range5_1,
                       (char (*) [52])"Storage block indices are expected to be continuous");
            pCVar15 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar15,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x319);
            std::__cxx11::string::~string((string *)&__range5_1);
          }
          (pvVar26->super_GLResourceAttribs).ArraySize = (Uint32)OpenBracketPtr_1;
          OpenBracketPtr_1._7_1_ = 0;
        }
        else {
          this_00 = &NamesPool._M_h._M_single_bucket;
          __end5_1 = std::
                     vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                     ::begin((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                              *)this_00);
          sb = (StorageBlockInfo *)
               std::
               vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
               ::end((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                      *)this_00);
          while (bVar12 = __gnu_cxx::operator!=
                                    (&__end5_1,
                                     (__normal_iterator<Diligent::ShaderResourcesGL::StorageBlockInfo_*,_std::vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>_>
                                      *)&sb), bVar12) {
            msg_19.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<Diligent::ShaderResourcesGL::StorageBlockInfo_*,_std::vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>_>
                 ::operator*(&__end5_1);
            pcVar22 = (((reference)msg_19.field_2._8_8_)->super_GLResourceAttribs).Name;
            pcVar25 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)&i);
            iVar13 = strcmp(pcVar22,pcVar25);
            if (iVar13 == 0) {
              FormatString<char[30],char_const*,char[30]>
                        ((string *)local_588,(Diligent *)"Storage block with the name \"",
                         (char (*) [30])msg_19.field_2._8_8_,
                         (char **)"\" has already been enumerated",(char (*) [30])pcVar19);
              pCVar15 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar15,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x321);
              std::__cxx11::string::~string((string *)local_588);
            }
            __gnu_cxx::
            __normal_iterator<Diligent::ShaderResourcesGL::StorageBlockInfo_*,_std::vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>_>
            ::operator++(&__end5_1);
          }
        }
      }
    }
    if ((OpenBracketPtr_1._7_1_ & 1) != 0) {
      local_5a8 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)&i);
      pVar29 = std::
               unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::emplace<char*>((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&UniformVars.
                                    super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5a8);
      local_5b8._M_cur =
           (__node_type *)
           pVar29.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_5b0 = pVar29.second;
      local_5a0._M_cur = local_5b8._M_cur;
      local_598 = local_5b0;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_5a0);
      local_590 = (char *)std::__cxx11::string::c_str();
      local_5b9 = SHADER_RESOURCE_TYPE_BUFFER_UAV;
      local_5c0 = (Uint32)OpenBracketPtr_1;
      std::
      vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                ((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
                  *)&NamesPool._M_h._M_single_bucket,&local_590,(SHADER_TYPE *)msg.field_2._8_8_,
                 &local_5b9,&local_5c0,(uint *)(msg_17.field_2._M_local_buf + 0xc));
    }
    err_8 = err_8 + 1;
  } while( true );
}

Assistant:

void ShaderResourcesGL::LoadUniforms(const LoadUniformsAttribs& Attribs)
{
    VERIFY(Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_NONE || Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER,
           "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags");

    // Load uniforms to temporary arrays. We will then pack all variables into a single chunk of memory.
    std::vector<UniformBufferInfo> UniformBlocks;
    std::vector<TextureInfo>       Textures;
    std::vector<ImageInfo>         Images;
    std::vector<StorageBlockInfo>  StorageBlocks;
    std::unordered_set<String>     NamesPool;

    // Linear list of unrolled uniform variables grouped by the uniform block index, e.g.:
    //   0: f4, u4, s1.f4[0]
    //   1: s2.s1.f4[0], s3.s2[0].s1.f4[1]
    std::vector<std::vector<ShaderCodeVariableDescX>> UniformVars;

    VERIFY(Attribs.GLProgram, "Null GL program");
    Attribs.State.SetProgram(Attribs.GLProgram);

    GLuint GLProgram = Attribs.GLProgram;
    m_ShaderStages   = Attribs.ShaderStages;

    GLint numActiveUniforms = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORMS, &numActiveUniforms);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniforms\n");

    // Query the maximum name length of the active uniform (including null terminator)
    GLint activeUniformMaxLength = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_MAX_LENGTH, &activeUniformMaxLength);
    DEV_CHECK_GL_ERROR("Unable to get the maximum uniform name length\n");

    GLint numActiveUniformBlocks = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCKS, &numActiveUniformBlocks);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniform blocks\n");

    //
    // #### This parameter is currently unsupported by Intel OGL drivers.
    //
    // Query the maximum name length of the active uniform block (including null terminator)
    GLint activeUniformBlockMaxLength = 0;
    // On Intel driver, this call might fail:
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, &activeUniformBlockMaxLength);
#ifdef DILIGENT_DEVELOPMENT
    if (glGetError() != GL_NO_ERROR)
    {
        LOG_WARNING_MESSAGE("Unable to get the maximum uniform block name length.");
    }
#endif

    if (activeUniformBlockMaxLength <= 0)
        activeUniformBlockMaxLength = 1024;

    auto MaxNameLength = std::max(activeUniformMaxLength, activeUniformBlockMaxLength);

#if GL_ARB_program_interface_query
    GLint numActiveShaderStorageBlocks = 0;
    if (glGetProgramInterfaceiv)
    {
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, &numActiveShaderStorageBlocks);
        DEV_CHECK_GL_ERROR("Unable to get the number of shader storage blocks\n");

        // Query the maximum name length of the active shader storage block (including null terminator)
        GLint MaxShaderStorageBlockNameLen = 0;
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, &MaxShaderStorageBlockNameLen);
        DEV_CHECK_GL_ERROR("Unable to get the maximum shader storage block name length\n");
        MaxNameLength = std::max(MaxNameLength, MaxShaderStorageBlockNameLen);
    }
#endif

    MaxNameLength = std::max(MaxNameLength, 512);
    std::vector<GLchar> Name(static_cast<size_t>(MaxNameLength) + 1);
    for (int i = 0; i < numActiveUniforms; i++)
    {
        GLenum dataType = 0;
        GLint  size     = 0;
        GLint  NameLen  = 0;
        // If one or more elements of an array are active, the name of the array is returned in 'name',
        // the type is returned in 'type', and the 'size' parameter returns the highest array element index used,
        // plus one, as determined by the compiler and/or linker.
        // Only one active uniform variable will be reported for a uniform array.
        // Uniform variables other than arrays will have a size of 1
        glGetActiveUniform(GLProgram, i, MaxNameLength, &NameLen, &size, &dataType, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform name");
        VERIFY(size >= 1, "Size is expected to be at least 1");
        // Note that
        // glGetActiveUniform( program, index, bufSize, length, size, type, name );
        //
        // is equivalent to
        //
        // const enum props[] = { ARRAY_SIZE, TYPE };
        // glGetProgramResourceName( program, UNIFORM, index, bufSize, length, name );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[0], 1, NULL, size );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[1], 1, NULL, (int *)type );
        //
        // The latter is only available in GL 4.4 and GLES 3.1

        RESOURCE_DIMENSION ResDim;
        bool               IsMS;
        GLTextureTypeToResourceDim(dataType, ResDim, IsMS);

        switch (dataType)
        {
            case GL_SAMPLER_1D:
            case GL_SAMPLER_2D:
            case GL_SAMPLER_3D:
            case GL_SAMPLER_CUBE:
            case GL_SAMPLER_1D_SHADOW:
            case GL_SAMPLER_2D_SHADOW:

            case GL_SAMPLER_1D_ARRAY:
            case GL_SAMPLER_2D_ARRAY:
            case GL_SAMPLER_1D_ARRAY_SHADOW:
            case GL_SAMPLER_2D_ARRAY_SHADOW:
            case GL_SAMPLER_CUBE_SHADOW:

            case GL_SAMPLER_EXTERNAL_OES:

            case GL_INT_SAMPLER_1D:
            case GL_INT_SAMPLER_2D:
            case GL_INT_SAMPLER_3D:
            case GL_INT_SAMPLER_CUBE:
            case GL_INT_SAMPLER_1D_ARRAY:
            case GL_INT_SAMPLER_2D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_1D:
            case GL_UNSIGNED_INT_SAMPLER_2D:
            case GL_UNSIGNED_INT_SAMPLER_3D:
            case GL_UNSIGNED_INT_SAMPLER_CUBE:
            case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:

            case GL_SAMPLER_CUBE_MAP_ARRAY:
            case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:
            case GL_INT_SAMPLER_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:

            case GL_SAMPLER_2D_MULTISAMPLE:
            case GL_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:

            case GL_SAMPLER_BUFFER:
            case GL_INT_SAMPLER_BUFFER:
            case GL_UNSIGNED_INT_SAMPLER_BUFFER:
            {
                const auto IsBuffer =
                    dataType == GL_SAMPLER_BUFFER ||
                    dataType == GL_INT_SAMPLER_BUFFER ||
                    dataType == GL_UNSIGNED_INT_SAMPLER_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_SRV :
                    SHADER_RESOURCE_TYPE_TEXTURE_SRV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    Attribs.SamplerResourceFlag // PIPELINE_RESOURCE_FLAG_NONE for HLSL source or
                                                // PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER for GLSL source
                    ;

                RemoveArrayBrackets(Name.data());

                Textures.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }

#if GL_ARB_shader_image_load_store
            case GL_IMAGE_1D:
            case GL_IMAGE_2D:
            case GL_IMAGE_3D:
            case GL_IMAGE_2D_RECT:
            case GL_IMAGE_CUBE:
            case GL_IMAGE_BUFFER:
            case GL_IMAGE_1D_ARRAY:
            case GL_IMAGE_2D_ARRAY:
            case GL_IMAGE_CUBE_MAP_ARRAY:
            case GL_IMAGE_2D_MULTISAMPLE:
            case GL_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_INT_IMAGE_1D:
            case GL_INT_IMAGE_2D:
            case GL_INT_IMAGE_3D:
            case GL_INT_IMAGE_2D_RECT:
            case GL_INT_IMAGE_CUBE:
            case GL_INT_IMAGE_BUFFER:
            case GL_INT_IMAGE_1D_ARRAY:
            case GL_INT_IMAGE_2D_ARRAY:
            case GL_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_INT_IMAGE_2D_MULTISAMPLE:
            case GL_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_1D:
            case GL_UNSIGNED_INT_IMAGE_2D:
            case GL_UNSIGNED_INT_IMAGE_3D:
            case GL_UNSIGNED_INT_IMAGE_2D_RECT:
            case GL_UNSIGNED_INT_IMAGE_CUBE:
            case GL_UNSIGNED_INT_IMAGE_BUFFER:
            case GL_UNSIGNED_INT_IMAGE_1D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            {
                const auto IsBuffer =
                    dataType == GL_IMAGE_BUFFER ||
                    dataType == GL_INT_IMAGE_BUFFER ||
                    dataType == GL_UNSIGNED_INT_IMAGE_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_UAV :
                    SHADER_RESOURCE_TYPE_TEXTURE_UAV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    PIPELINE_RESOURCE_FLAG_NONE;

                RemoveArrayBrackets(Name.data());

                Images.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }
#endif

            default:
                // Some other uniform type like scalar, matrix etc.
                if (Attribs.LoadUniformBufferReflection)
                {
                    auto VarDesc = GLDataTypeToShaderCodeVariableDesc(dataType);
                    if (VarDesc.BasicType != SHADER_CODE_BASIC_TYPE_UNKNOWN)
                    {
                        // All uniforms are reported as unrolled variables, e.g. s2.s1[1].f4[0]
                        VarDesc.Name = Name.data();
                        AddUniformBufferVariable(GLProgram, i, VarDesc, UniformVars, Attribs.SourceLang);
                    }
                }
                break;
        }
    }

    for (int i = 0; i < numActiveUniformBlocks; i++)
    {
        // In contrast to shader uniforms, every element in uniform block array is enumerated individually
        GLsizei NameLen = 0;
        glGetActiveUniformBlockName(GLProgram, i, MaxNameLength, &NameLen, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block name\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform block name");

        // glGetActiveUniformBlockName( program, uniformBlockIndex, bufSize, length, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceName(program, GL_UNIFORM_BLOCK, uniformBlockIndex, bufSize, length, uniformBlockName);

        auto UniformBlockIndex = glGetUniformBlockIndex(GLProgram, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block index\n");
        // glGetUniformBlockIndex( program, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceIndex( program, GL_UNIFORM_BLOCK, uniformBlockName );

        bool IsNewBlock = true;

        GLint ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!UniformBlocks.empty())
            {
                // Look at previous uniform block to check if it is the same array
                auto& LastBlock = UniformBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(UniformBlockIndex == LastBlock.UBIndex + Ind, "Uniform block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#ifdef DILIGENT_DEBUG
                    for (const auto& ub : UniformBlocks)
                        VERIFY(strcmp(ub.Name, Name.data()) != 0, "Uniform block with the name '", ub.Name, "' has already been enumerated");
#endif
                }
            }
        }

        if (IsNewBlock)
        {
            UniformBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_CONSTANT_BUFFER,
                static_cast<Uint32>(ArraySize),
                UniformBlockIndex //
            );
        }
    }

#if GL_ARB_shader_storage_buffer_object
    for (int i = 0; i < numActiveShaderStorageBlocks; ++i)
    {
        GLsizei Length = 0;
        glGetProgramResourceName(GLProgram, GL_SHADER_STORAGE_BLOCK, i, MaxNameLength, &Length, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block name\n");
        VERIFY(Length < MaxNameLength && static_cast<size_t>(Length) == strlen(Name.data()), "Incorrect shader storage block name");

        auto SBIndex = glGetProgramResourceIndex(GLProgram, GL_SHADER_STORAGE_BLOCK, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block index\n");

        bool  IsNewBlock     = true;
        Int32 ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!StorageBlocks.empty())
            {
                // Look at previous storage block to check if it is the same array
                auto& LastBlock = StorageBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(static_cast<GLint>(SBIndex) == LastBlock.SBIndex + Ind, "Storage block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#    ifdef DILIGENT_DEBUG
                    for (const auto& sb : StorageBlocks)
                        VERIFY(strcmp(sb.Name, Name.data()) != 0, "Storage block with the name \"", sb.Name, "\" has already been enumerated");
#    endif
                }
            }
        }

        if (IsNewBlock)
        {
            StorageBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_BUFFER_UAV,
                static_cast<Uint32>(ArraySize),
                SBIndex //
            );
        }
    }
#endif

    Attribs.State.SetProgram(GLObjectWrappers::GLProgramObj::Null());

    AllocateResources(UniformBlocks, Textures, Images, StorageBlocks);

    if (!UniformVars.empty())
    {
        VERIFY_EXPR(Attribs.LoadUniformBufferReflection);

        std::vector<ShaderCodeBufferDescX> UBReflections;
        for (const auto& UB : UniformBlocks)
        {
            if (UB.UBIndex < UniformVars.size())
            {
                auto& Vars = UniformVars[UB.UBIndex];

                GLint BufferSize = 0;
                glGetActiveUniformBlockiv(GLProgram, UB.UBIndex, GL_UNIFORM_BLOCK_DATA_SIZE, &BufferSize);
                DEV_CHECK_GL_ERROR("Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter");

                UBReflections.emplace_back(PrepareUBReflection(std::move(Vars), StaticCast<Uint32>(BufferSize)));
            }
            else
            {
                UNEXPECTED("Uniform block ", UB.UBIndex, " has no variables.");
            }
        }

        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
}